

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

HighsInt __thiscall
HighsOrbitopeMatrix::orbitalFixingForFullOrbitope
          (HighsOrbitopeMatrix *this,vector<int,_std::allocator<int>_> *rows,HighsDomain *domain)

{
  double *pdVar1;
  uint uVar2;
  bool bVar3;
  pointer pcVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  void *pvVar10;
  char cVar11;
  void *pvVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  double dVar18;
  HighsDomainChange boundchg;
  vector<signed_char,_std::allocator<signed_char>_> Mminimal;
  int local_8c;
  void *local_88;
  allocator_type local_72;
  value_type local_71;
  void *local_70;
  long local_68;
  vector<signed_char,_std::allocator<signed_char>_> local_60;
  long local_48;
  long local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  uVar14 = (ulong)((long)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  uVar13 = (uint)uVar14;
  local_68 = (long)(int)uVar13;
  local_71 = -1;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            (&local_60,this->rowLength * local_68,&local_71,&local_72);
  if (0 < this->rowLength) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      if (0 < (int)uVar13) {
        uVar9 = 0;
        do {
          iVar5 = (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [(long)this->numRows * (long)(int)lVar7 +
                   (long)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar9]];
          dVar18 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar5];
          cVar11 = '\x01';
          if ((dVar18 != 1.0) || (NAN(dVar18))) {
            dVar18 = (domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar5];
            if ((dVar18 == 0.0) && (!NAN(dVar18))) {
              cVar11 = '\0';
              goto LAB_002ff1f4;
            }
          }
          else {
LAB_002ff1f4:
            local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9 + lVar6] = cVar11;
          }
          uVar9 = uVar9 + 1;
        } while ((uVar13 & 0x7fffffff) != uVar9);
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + (ulong)(uVar13 & 0x7fffffff);
    } while (lVar7 < this->rowLength);
  }
  uVar9 = (long)local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar9 == 0) {
    local_88 = (void *)0x0;
  }
  else {
    if ((long)uVar9 < 0) {
      std::__throw_bad_alloc();
    }
    local_88 = operator_new(uVar9);
  }
  pcVar4 = local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    memmove(local_88,local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_start);
  }
  if (0 < (int)uVar13) {
    iVar5 = (this->rowLength + -1) * uVar13;
    uVar9 = 0;
    do {
      if (pcVar4[uVar9 + (long)iVar5] == -1) {
        pcVar4[uVar9 + (long)iVar5] = '\0';
      }
      if (*(char *)((long)local_88 + uVar9) == -1) {
        *(undefined1 *)((long)local_88 + uVar9) = 1;
      }
      uVar9 = uVar9 + 1;
    } while ((uVar13 & 0x7fffffff) != uVar9);
  }
  local_38 = rows;
  if (1 < (long)this->rowLength) {
    lVar6 = (long)this->rowLength + -2;
    local_70 = (void *)(long)(int)uVar13;
    lVar7 = (long)local_70 * lVar6;
    pvVar10 = (void *)((long)local_70 + lVar7);
    do {
      uVar9 = 0;
      if (0 < (int)uVar13) {
        uVar9 = 0;
        do {
          if (((local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9 + lVar7] != -1) &&
              ((local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start + (long)pvVar10)[uVar9] != -1)) &&
             (local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9 + lVar7] !=
              (local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start + (long)pvVar10)[uVar9])) goto LAB_002ff334;
          uVar9 = uVar9 + 1;
        } while ((uVar13 & 0x7fffffff) != uVar9);
        uVar9 = uVar14 & 0xffffffff;
      }
LAB_002ff334:
      uVar8 = uVar9;
      if ((int)uVar13 <= (int)uVar9) {
        uVar8 = uVar14;
      }
      uVar17 = uVar8 & 0xffffffff;
      if ((int)uVar9 < (int)uVar13) {
        uVar9 = 0xffffffff;
        if (-1 < (int)uVar8) {
          lVar16 = uVar17 + 1;
          do {
            if ((local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar16 + lVar7 + -1] != '\0') &&
               (uVar9 = uVar17,
               (local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start + (long)pvVar10)[lVar16 + -1] != '\x01')) break;
            uVar17 = (ulong)((int)uVar17 - 1);
            lVar15 = lVar16 + -1;
            bVar3 = 0 < lVar16;
            uVar9 = 0xffffffff;
            lVar16 = lVar15;
          } while (lVar15 != 0 && bVar3);
        }
        iVar5 = (int)uVar9;
        if (iVar5 == -1) {
          domain->infeasible_ = true;
          domain->infeasible_pos =
               (HighsInt)
               ((ulong)((long)(domain->domchgstack_).
                              super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(domain->domchgstack_).
                             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
          (domain->infeasible_reason).type = -2;
          (domain->infeasible_reason).index = 0;
        }
        else {
          if (0 < iVar5) {
            uVar8 = 0;
            do {
              cVar11 = local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar8 + lVar7];
              local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8 + lVar7] =
                   ((local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                     super__Vector_impl_data._M_start + (long)pvVar10)[uVar8] & cVar11 == -1) +
                   (cVar11 == -1) + cVar11;
              uVar8 = uVar8 + 1;
            } while (uVar9 != uVar8);
          }
          local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[(long)iVar5 + lVar6 * (long)local_70] = '\x01';
          if (iVar5 + 1 < (int)uVar13) {
            lVar15 = (iVar5 + 1) + lVar7;
            lVar16 = 0;
            do {
              cVar11 = local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar16 + lVar15];
              if (local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar16 + lVar15] == -1) {
                cVar11 = '\0';
              }
              local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar16 + lVar15] = cVar11;
              lVar16 = lVar16 + 1;
            } while ((uVar13 - 1) - iVar5 != (int)lVar16);
          }
        }
        if (iVar5 == -1) goto LAB_002ff7bb;
      }
      else if (0 < (int)uVar13) {
        uVar9 = 0;
        do {
          cVar11 = local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9 + lVar7];
          local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9 + lVar7] =
               ((local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start + (long)pvVar10)[uVar9] & cVar11 == -1) +
               (cVar11 == -1) + cVar11;
          uVar9 = uVar9 + 1;
        } while ((uVar13 & 0x7fffffff) != uVar9);
      }
      pvVar10 = (void *)((long)pvVar10 - (long)local_70);
      lVar7 = lVar7 - (long)local_70;
      bVar3 = 0 < lVar6;
      lVar6 = lVar6 + -1;
    } while (bVar3);
  }
  if (1 < this->rowLength) {
    lVar6 = (long)(int)uVar13;
    local_70 = (void *)((ulong)((long)(domain->domchgstack_).
                                      super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(domain->domchgstack_).
                                     super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
    lVar7 = 1;
    pvVar12 = local_88;
    pvVar10 = local_88;
    do {
      pvVar10 = (void *)((long)pvVar10 + lVar6);
      uVar9 = 0;
      if (0 < (int)uVar13) {
        uVar9 = 0;
        do {
          cVar11 = *(char *)((long)pvVar10 + uVar9 + -lVar6);
          if (((cVar11 != -1) && (*(char *)((long)pvVar10 + uVar9) != -1)) &&
             (cVar11 != *(char *)((long)pvVar10 + uVar9))) goto LAB_002ff51a;
          uVar9 = uVar9 + 1;
        } while ((uVar13 & 0x7fffffff) != uVar9);
        uVar9 = uVar14 & 0xffffffff;
      }
LAB_002ff51a:
      iVar5 = (int)uVar9;
      uVar8 = uVar14;
      if (iVar5 < (int)uVar13) {
        uVar8 = uVar9;
      }
      uVar9 = uVar8 & 0xffffffff;
      if (iVar5 < (int)uVar13) {
        uVar17 = 0xffffffff;
        if (-1 < (int)uVar8) {
          lVar16 = 0;
          do {
            if ((*(char *)((long)pvVar10 + lVar16 + -lVar6 + uVar9) != '\0') &&
               (*(char *)((long)pvVar10 + lVar16 + uVar9) != '\x01')) {
              if (local_68 <= iVar5) {
                iVar5 = (int)local_68;
              }
              uVar17 = (ulong)(uint)((int)lVar16 + iVar5);
              break;
            }
            lVar15 = lVar16 + uVar9 + 1;
            lVar16 = lVar16 + -1;
          } while (lVar15 != 1 && -1 < lVar15 + -1);
        }
        iVar5 = (int)uVar17;
        if (iVar5 == -1) {
          domain->infeasible_ = true;
          domain->infeasible_pos = (HighsInt)local_70;
          (domain->infeasible_reason).type = -2;
          (domain->infeasible_reason).index = 0;
        }
        else {
          if (0 < iVar5) {
            uVar9 = 0;
            do {
              cVar11 = *(char *)((long)pvVar10 + uVar9);
              *(byte *)((long)pvVar10 + uVar9) =
                   (*(byte *)((long)pvVar12 + uVar9) & cVar11 == -1) + (cVar11 == -1) + cVar11;
              uVar9 = uVar9 + 1;
            } while (uVar17 != uVar9);
          }
          *(undefined1 *)((long)local_88 + (long)iVar5 + lVar7 * lVar6) = 0;
          lVar16 = (long)iVar5 + 1;
          if ((int)lVar16 < (int)uVar13) {
            lVar15 = 0;
            do {
              cVar11 = *(char *)((long)pvVar10 + lVar15 + lVar16);
              *(char *)((long)pvVar10 + lVar15 + lVar16) = (cVar11 == -1) * '\x02' + cVar11;
              lVar15 = lVar15 + 1;
            } while ((uVar13 - 1) - iVar5 != (int)lVar15);
          }
        }
        if (iVar5 == -1) goto LAB_002ff7bb;
      }
      else if (0 < (int)uVar13) {
        uVar9 = 0;
        do {
          cVar11 = *(char *)((long)pvVar10 + uVar9);
          *(byte *)((long)pvVar10 + uVar9) =
               (*(byte *)((long)pvVar12 + uVar9) & cVar11 == -1) + (cVar11 == -1) + cVar11;
          uVar9 = uVar9 + 1;
        } while ((uVar13 & 0x7fffffff) != uVar9);
      }
      lVar7 = lVar7 + 1;
      pvVar12 = (void *)((long)pvVar12 + lVar6);
    } while (lVar7 < this->rowLength);
  }
  if (this->rowLength < 1) {
    local_8c = 0;
  }
  else {
    local_48 = (long)(int)uVar13;
    lVar6 = 0;
    lVar7 = 0;
    local_8c = 0;
    pvVar10 = local_88;
    do {
      pcVar4 = local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_68 = lVar6;
      local_40 = lVar7;
      if (0 < (int)uVar13) {
        uVar14 = 0;
        local_70 = pvVar10;
        while (cVar11 = pcVar4[uVar14 + lVar6], cVar11 == *(char *)((long)pvVar10 + uVar14)) {
          uVar2 = (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [(long)this->numRows * (long)(int)lVar7 +
                   (long)(local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar14]];
          dVar18 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar2];
          pdVar1 = (domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + (int)uVar2;
          if ((dVar18 != *pdVar1) || (iVar5 = 0x28, NAN(dVar18) || NAN(*pdVar1))) {
            dVar18 = 1.0;
            if (cVar11 != '\x01') {
              dVar18 = 0.0;
            }
            uVar9 = (ulong)uVar2 + 0x100000000;
            if (cVar11 == '\x01') {
              uVar9 = (ulong)uVar2;
            }
            boundchg.column = (int)uVar9;
            boundchg.boundtype = (int)(uVar9 >> 0x20);
            boundchg.boundval = dVar18;
            HighsDomain::changeBound(domain,boundchg,(Reason)0xfffffffe);
            local_8c = local_8c + 1;
            pvVar10 = local_70;
            iVar5 = 0;
            if (domain->infeasible_ != false) {
              iVar5 = 0x26;
            }
          }
          if (((iVar5 != 0x28) && (iVar5 != 0)) ||
             (uVar14 = uVar14 + 1, (uVar13 & 0x7fffffff) == uVar14)) break;
        }
      }
      if (domain->infeasible_ == true) break;
      lVar7 = local_40 + 1;
      pvVar10 = (void *)((long)pvVar10 + local_48);
      lVar6 = local_68 + local_48;
    } while (lVar7 < this->rowLength);
  }
  if (domain->infeasible_ == false) {
    HighsDomain::propagate(domain);
  }
LAB_002ff7f1:
  if (local_88 != (void *)0x0) {
    operator_delete(local_88);
  }
  if (local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return local_8c;
LAB_002ff7bb:
  local_8c = 0;
  goto LAB_002ff7f1;
}

Assistant:

HighsInt HighsOrbitopeMatrix::orbitalFixingForFullOrbitope(
    const std::vector<HighsInt>& rows, HighsDomain& domain) const {
  HighsInt numDynamicRows = rows.size();
  std::vector<int8_t> Mminimal(numDynamicRows * rowLength, -1);

  for (HighsInt j = 0; j < rowLength; ++j) {
    for (HighsInt i = 0; i < numDynamicRows; ++i) {
      HighsInt r = rows[i];
      HighsInt colij = matrix[r + j * numRows];
      if (domain.col_lower_[colij] == 1.0)
        Mminimal[i + j * numDynamicRows] = 1;
      else if (domain.col_upper_[colij] == 0.0)
        Mminimal[i + j * numDynamicRows] = 0;
    }
  }

  std::vector<int8_t> Mmaximal = Mminimal;

  int8_t* MminimaljLast = Mminimal.data() + numDynamicRows * (rowLength - 1);
  int8_t* MmaximaljFirst = Mmaximal.data();
  for (HighsInt k = 0; k < numDynamicRows; ++k) {
    if (MminimaljLast[k] == -1) MminimaljLast[k] = 0;
    if (MmaximaljFirst[k] == -1) MmaximaljFirst[k] = 1;
  }

  auto i_fixed = [&](const int8_t* colj0, const int8_t* colj1) {
    for (HighsInt i = 0; i < numDynamicRows; ++i) {
      if (colj0[i] != -1 && colj1[i] != -1 && colj0[i] != colj1[i]) return i;
    }

    return numDynamicRows;
  };

  auto i_discr = [&](const int8_t* colj0, const int8_t* colj1, HighsInt i_f) {
    for (HighsInt i = i_f; i >= 0; --i) {
      if (colj0[i] != 0 && colj1[i] != 1) return i;
    }

    return HighsInt{-1};
  };

  for (HighsInt j = rowLength - 2; j >= 0; --j) {
    int8_t* colj0 = Mminimal.data() + j * numDynamicRows;
    int8_t* colj1 = colj0 + numDynamicRows;
    HighsInt i_f = i_fixed(colj0, colj1);

    if (i_f == numDynamicRows) {
      for (HighsInt k = 0; k < numDynamicRows; ++k) {
        int8_t isFree = (colj0[k] == -1);
        colj0[k] += (isFree & colj1[k]) + isFree;
      }
    } else {
      HighsInt i_d = i_discr(colj0, colj1, i_f);
      if (i_d == -1) {
        domain.markInfeasible();
        return 0;
      }

      for (HighsInt k = 0; k < i_d; ++k) {
        int8_t isFree = (colj0[k] == -1);
        colj0[k] += (isFree & colj1[k]) + isFree;
      }
      colj0[i_d] = 1;
      for (HighsInt k = i_d + 1; k < numDynamicRows; ++k)
        colj0[k] += (colj0[k] == -1);
    }
  }

  for (HighsInt j = 1; j < rowLength; ++j) {
    int8_t* colj0 = Mmaximal.data() + j * numDynamicRows;
    int8_t* colj1 = colj0 - numDynamicRows;
    HighsInt i_f = i_fixed(colj1, colj0);

    if (i_f == numDynamicRows) {
      for (HighsInt k = 0; k < numDynamicRows; ++k) {
        int8_t isFree = (colj0[k] == -1);
        colj0[k] += (isFree & colj1[k]) + isFree;
      }
    } else {
      HighsInt i_d = i_discr(colj1, colj0, i_f);
      if (i_d == -1) {
        domain.markInfeasible();
        return 0;
      }
      for (HighsInt k = 0; k < i_d; ++k) {
        int8_t isFree = (colj0[k] == -1);
        colj0[k] += (isFree & colj1[k]) + isFree;
      }
      colj0[i_d] = 0;
      for (HighsInt k = i_d + 1; k < numDynamicRows; ++k)
        colj0[k] += 2 * (colj0[k] == -1);
    }
  }

  HighsInt numFixed = 0;

  for (HighsInt j = 0; j < rowLength; ++j) {
    const int8_t* colMaximal = Mmaximal.data() + j * numDynamicRows;
    const int8_t* colMinimal = Mminimal.data() + j * numDynamicRows;

    for (HighsInt i = 0; i < numDynamicRows; ++i) {
      if (colMinimal[i] != colMaximal[i]) {
        assert(colMinimal[i] < colMaximal[i]);
        break;
      }

      HighsInt r = rows[i];
      HighsInt colrj = matrix[r + j * numRows];
      if (domain.isFixed(colrj)) continue;

      ++numFixed;
      if (colMinimal[i] == 1)
        domain.changeBound(HighsBoundType::kLower, colrj, 1.0,
                           HighsDomain::Reason::unspecified());
      else
        domain.changeBound(HighsBoundType::kUpper, colrj, 0.0,
                           HighsDomain::Reason::unspecified());
      if (domain.infeasible()) break;
    }
    if (domain.infeasible()) break;
  }

  if (!domain.infeasible()) domain.propagate();

  return numFixed;
}